

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filetime.cpp
# Opt level: O0

BOOL FileTimeToSystemTime(FILETIME *lpFileTime,LPSYSTEMTIME lpSystemTime)

{
  tm *ptVar1;
  undefined1 local_78 [8];
  tm timeBuf;
  UINT64 since1601;
  tm *UnixSystemTime;
  time_t UnixFileTime;
  UINT64 FileTime;
  LPSYSTEMTIME lpSystemTime_local;
  FILETIME *lpFileTime_local;
  
  UnixSystemTime = (tm *)0x0;
  UnixFileTime = *(time_t *)lpFileTime;
  timeBuf.tm_zone = (char *)0x19db1ded53e8000;
  FileTime = (UINT64)lpSystemTime;
  lpSystemTime_local = (LPSYSTEMTIME)lpFileTime;
  if ((ulong)UnixFileTime < 0x19db1ded53e8001) {
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    SetLastError(0x57);
    lpFileTime_local._4_4_ = 0;
  }
  else {
    UnixFileTime = UnixFileTime + 0xfe624e212ac18000;
    if (UnixFileTime < 0) {
      UnixSystemTime = (tm *)(-1 - (0xffffffffffffffffU - UnixFileTime) / 10000000);
    }
    else {
      UnixSystemTime = (tm *)((ulong)UnixFileTime / 10000000);
    }
    ptVar1 = gmtime_r((time_t *)&UnixSystemTime,(tm *)local_78);
    *(short *)(FileTime + 6) = (short)ptVar1->tm_mday;
    *(short *)(FileTime + 2) = (short)ptVar1->tm_mon + 1;
    *(short *)FileTime = (short)ptVar1->tm_year + 0x76c;
    *(short *)(FileTime + 0xc) = (short)ptVar1->tm_sec;
    *(short *)(FileTime + 10) = (short)ptVar1->tm_min;
    *(short *)(FileTime + 8) = (short)ptVar1->tm_hour;
    lpFileTime_local._4_4_ = 1;
  }
  return lpFileTime_local._4_4_;
}

Assistant:

BOOL PALAPI FileTimeToSystemTime( CONST FILETIME * lpFileTime, 
                                  LPSYSTEMTIME lpSystemTime )
{
    UINT64 FileTime = 0;
    time_t UnixFileTime = 0;
    struct tm * UnixSystemTime = 0;

    /* Combine the file time. */
    FileTime = lpFileTime->dwHighDateTime;
    FileTime <<= 32;
    FileTime |= (UINT)lpFileTime->dwLowDateTime;
    const UINT64 since1601 = SECS_BETWEEN_1601_AND_1970_EPOCHS * SECS_TO_100NS;

    if (FileTime > since1601 && since1601 >= 0) 
    {
        FileTime -= since1601;
#if HAVE_GMTIME_R
        struct tm timeBuf;
#endif  /* HAVE_GMTIME_R */
        /* Convert file time to unix time. */
        if (((INT64)FileTime) < 0)
        {
            UnixFileTime =  -1 - ( ( -FileTime - 1 ) / 10000000 );            
        }
        else
        {
            UnixFileTime = FileTime / 10000000;
        }

        /* Convert unix file time to Unix System time. */
#if HAVE_GMTIME_R
        UnixSystemTime = gmtime_r( &UnixFileTime, &timeBuf );
#else   /* HAVE_GMTIME_R */
        UnixSystemTime = gmtime( &UnixFileTime );
#endif  /* HAVE_GMTIME_R */

        /* Convert unix system time to Windows system time. */
        lpSystemTime->wDay      = UnixSystemTime->tm_mday;
    
        /* Unix time counts January as a 0, under Windows it is 1*/
        lpSystemTime->wMonth    = UnixSystemTime->tm_mon + 1;
        /* Unix time returns the year - 1900, Windows returns the current year*/
        lpSystemTime->wYear     = UnixSystemTime->tm_year + 1900;
        
        lpSystemTime->wSecond   = UnixSystemTime->tm_sec;
        lpSystemTime->wMinute   = UnixSystemTime->tm_min;
        lpSystemTime->wHour     = UnixSystemTime->tm_hour;
        return TRUE;
    }
    else
    {
        ERROR( "The file time is to large.\n" );
        SetLastError(ERROR_INVALID_PARAMETER);
        return FALSE;
    }
}